

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

bool __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::erase(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        *this,pair<unsigned_long_long,_int> *key)

{
  ulong uVar1;
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *pDVar2;
  _func_int *p_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  locType *pos;
  node **ppnVar7;
  int *piVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar10;
  node *pnVar11;
  undefined8 *puVar12;
  uint uVar13;
  long lVar14;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *this_00;
  pair<unsigned_long_long,_int> *ppVar15;
  locType *plVar16;
  uint uVar17;
  node **ppnVar18;
  long lVar19;
  undefined8 *puVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  undefined8 uStack_70;
  undefined1 auStack_68 [20];
  int local_54;
  pair<unsigned_long_long,_int> *local_50;
  int *local_48;
  node **local_40;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *local_38;
  node *pnVar9;
  
  ppVar15 = (pair<unsigned_long_long,_int> *)auStack_68;
  iVar5 = this->depth;
  lVar22 = (long)iVar5;
  if (lVar22 == 0) {
    return false;
  }
  uVar23 = lVar22 * 8 + 8;
  if (iVar5 < -1) {
    uVar23 = 0xffffffffffffffff;
  }
  uVar25 = lVar22 * 4 + 4;
  if (iVar5 < -1) {
    uVar25 = 0xffffffffffffffff;
  }
  uStack_70 = 0x112df1;
  local_50 = key;
  local_38 = this;
  pos = (locType *)operator_new__(uVar23);
  *pos = 0;
  uStack_70 = 0x112e03;
  ppnVar7 = (node **)operator_new__(uVar23);
  uStack_70 = 0x112e0e;
  piVar8 = (int *)operator_new__(uVar25);
  *pos = local_38->root;
  local_40 = ppnVar7;
  if (iVar5 < 1) {
    ppnVar18 = ppnVar7 + lVar22;
    pnVar9 = ppnVar7[lVar22 + -1];
    iVar6 = pnVar9->sz;
  }
  else {
    lVar22 = 0;
    local_48 = piVar8;
    do {
      uStack_70 = 0x112e4a;
      iVar5 = (*(local_38->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[2])(local_38->file,pos + lVar22);
      pnVar9 = (node *)CONCAT44(extraout_var,iVar5);
      local_40[lVar22] = pnVar9;
      uVar13 = pnVar9->sz;
      uVar25 = 0;
      if (0 < (long)(int)uVar13) {
        uVar23 = local_50->first;
        piVar8 = &pnVar9->keyvalue[0].second;
        uVar25 = 0;
        do {
          if ((uVar23 <= ((pair<unsigned_long_long,_int> *)(piVar8 + -2))->first) &&
             ((uVar23 < ((pair<unsigned_long_long,_int> *)(piVar8 + -2))->first ||
              (local_50->second <= *piVar8)))) {
            iVar5 = local_38->depth;
            if ((long)iVar5 + -1 <= lVar22) goto LAB_00112ed3;
            if (((pair<unsigned_long_long,_int> *)(piVar8 + -2))->first <= uVar23) {
              if (((pair<unsigned_long_long,_int> *)(piVar8 + -2))->first < uVar23) {
                uVar25 = (ulong)((int)uVar25 + 1);
              }
              else if (*piVar8 <= local_50->second) {
                uVar25 = uVar25 + 1;
              }
            }
            goto LAB_00112ea8;
          }
          uVar25 = uVar25 + 1;
          piVar8 = piVar8 + 4;
        } while ((long)(int)uVar13 != uVar25);
        uVar25 = (ulong)uVar13;
      }
      iVar5 = local_38->depth;
      if (lVar22 < (long)iVar5 + -1) {
LAB_00112ea8:
        (pos + lVar22)[1] = (pnVar9->field_0).val[(int)uVar25];
      }
LAB_00112ed3:
      local_48[lVar22] = (int)uVar25;
      lVar22 = lVar22 + 1;
      lVar14 = (long)iVar5;
    } while (lVar22 < lVar14);
    pnVar9 = local_40[lVar14 + -1];
    iVar6 = pnVar9->sz;
    piVar8 = local_48;
    if ((int)uVar25 == iVar6) goto LAB_00112f4b;
    ppnVar18 = local_40 + lVar14;
  }
  ppnVar18 = ppnVar18 + -1;
  iVar24 = (int)uVar25;
  uVar23 = pnVar9->keyvalue[iVar24].first;
  if ((local_50->first < uVar23) ||
     ((local_50->first <= uVar23 && (local_50->second < pnVar9->keyvalue[iVar24].second)))) {
LAB_00112f4b:
    uStack_70 = 0x112f53;
    operator_delete__(local_40);
    uStack_70 = 0x112f5b;
    operator_delete__(piVar8);
    uStack_70 = 0x112f63;
    operator_delete__(pos);
    return false;
  }
  if (1 < iVar5 && iVar24 == 0) {
    plVar16 = pos + (iVar5 - 2);
    lVar22 = (ulong)(iVar5 - 2) + 1;
    do {
      lVar14 = (long)piVar8[lVar22 + -1];
      if (lVar14 != 0) {
        uVar23 = pnVar9->keyvalue[0].first;
        pnVar11 = local_40[lVar22 + -1];
        uVar1 = pnVar11->keyvalue[lVar14 + -1].first;
        if (((uVar1 <= uVar23) && (uVar23 <= uVar1)) &&
           (pnVar11->keyvalue[lVar14 + -1].second == pnVar9->keyvalue[0].second)) {
          pnVar11->keyvalue[lVar14 + -1].first = pnVar9->keyvalue[1].first;
          pnVar11->keyvalue[lVar14 + -1].second = pnVar9->keyvalue[1].second;
          uStack_70 = 0x1134d8;
          (*(local_38->file->
            super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
            )._vptr_FileManager_Base[3])(local_38->file,plVar16);
          pnVar9 = *ppnVar18;
          iVar6 = pnVar9->sz;
          break;
        }
      }
      plVar16 = plVar16 + -1;
      lVar14 = lVar22 + -1;
      bVar4 = 0 < lVar22;
      lVar22 = lVar14;
    } while (lVar14 != 0 && bVar4);
  }
  this_00 = local_38;
  ppnVar7 = local_40;
  if (iVar24 + 1 < iVar6) {
    lVar22 = (long)(iVar24 + 1);
    lVar14 = lVar22 * 0x10 + 0x330;
    do {
      iVar5 = (int)uVar25;
      pnVar9->keyvalue[iVar5].first = *(unsigned_long_long *)((long)pnVar9 + lVar14 + -8);
      pnVar9->keyvalue[iVar5].second = *(int *)((long)&pnVar9->field_0 + lVar14);
      (pnVar9->field_0).val[iVar5] = (pnVar9->field_0).val[lVar22];
      lVar22 = lVar22 + 1;
      pnVar9 = *ppnVar18;
      iVar6 = pnVar9->sz;
      uVar25 = (ulong)(iVar5 + 1);
      lVar14 = lVar14 + 0x10;
    } while (lVar22 < iVar6);
  }
  pnVar9->sz = iVar6 + -1;
  lVar22 = (long)local_38->depth;
  if (lVar22 == 1) {
    if (iVar6 + -1 == 0) {
      local_38->depth = 0;
      uStack_70 = 0x11314d;
      DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      ::release(local_38->file,local_38->root);
      this_00->root = -1;
      ppnVar7 = local_40;
    }
    else {
      uStack_70 = 0x11308f;
      (*(local_38->file->
        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        )._vptr_FileManager_Base[3])(local_38->file,&local_38->root);
      ppnVar7 = local_40;
    }
  }
  else {
    if (iVar6 < 0x33) {
      iVar5 = piVar8[lVar22 + -2];
      pnVar9 = local_40[lVar22 + -2];
      auStack_68._8_8_ = pos;
      local_48 = piVar8;
      if (iVar5 == pnVar9->sz) {
        local_40[lVar22] = local_40[lVar22 + -1];
        piVar8[lVar22] = iVar5;
        pos[lVar22] = pos[lVar22 + -1];
        iVar5 = pnVar9->sz;
        piVar8[lVar22 + -2] = iVar5 + -1;
        pos[lVar22 + -1] = *(locType *)((long)pnVar9 + (long)iVar5 * 8 + -8);
        uStack_70 = 0x11311d;
        iVar6 = (*(local_38->file->
                  super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                  )._vptr_FileManager_Base[2])(local_38->file,pos + lVar22 + -1);
        iVar5 = local_38->depth;
        lVar22 = (long)iVar5;
        local_40[lVar22 + -1] = (node *)CONCAT44(extraout_var_00,iVar6);
        pnVar9 = local_40[lVar22];
      }
      else {
        piVar8[lVar22] = iVar5 + 1;
        pos[lVar22] = *(locType *)((long)&pnVar9->field_0 + (long)iVar5 * 8 + 8);
        uStack_70 = 0x113189;
        iVar5 = (*(local_38->file->
                  super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                  )._vptr_FileManager_Base[2])(local_38->file,pos + lVar22);
        pnVar9 = (node *)CONCAT44(extraout_var_01,iVar5);
        iVar5 = local_38->depth;
        lVar22 = (long)iVar5;
        local_40[lVar22] = pnVar9;
      }
      this_00 = local_38;
      ppnVar7 = local_40;
      pos = (locType *)auStack_68._8_8_;
      pnVar11 = *ppnVar18;
      uVar23 = (ulong)(uint)pnVar11->sz;
      uVar13 = pnVar9->sz + pnVar11->sz;
      if ((int)uVar13 < 100) {
        if (0 < pnVar9->sz) {
          lVar14 = 0x66;
          lVar19 = 0;
          do {
            (pnVar11->field_0).val[(int)uVar23 + lVar19] = (pnVar9->field_0).val[lVar19];
            pnVar9 = local_40[lVar22];
            pnVar11 = *ppnVar18;
            iVar6 = pnVar11->sz;
            uVar23 = (ulong)iVar6;
            pnVar11->keyvalue[uVar23 + lVar19].first =
                 *(unsigned_long_long *)((long)pnVar9 + lVar14 * 8 + -8);
            pnVar11->keyvalue[uVar23 + lVar19].second =
                 *(int *)((long)&pnVar9->field_0 + lVar14 * 8);
            lVar19 = lVar19 + 1;
            lVar14 = lVar14 + 2;
          } while (lVar19 < pnVar9->sz);
          iVar5 = local_38->depth;
          uVar13 = pnVar9->sz + iVar6;
        }
        pnVar11->nxt = pnVar9->nxt;
        pnVar11->sz = uVar13;
        uStack_70 = 0x113246;
        (*(local_38->file->
          super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
          )._vptr_FileManager_Base[3])
                  (local_38->file,(locType *)(auStack_68._8_8_ + ((long)iVar5 + -1) * 8));
        uStack_70 = 0x113256;
        DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        ::release(this_00->file,pos[this_00->depth]);
        ppnVar7 = local_40;
        piVar8 = local_48;
        auStack_68._4_4_ = this_00->depth + -2;
        uStack_70 = 0x11327a;
        erasenonleaf(this_00,(int *)(auStack_68 + 4),local_40,local_48,pos);
        ppVar15 = (pair<unsigned_long_long,_int> *)auStack_68;
      }
      else {
        local_50 = (pair<unsigned_long_long,_int> *)auStack_68;
        uVar23 = (ulong)uVar13;
        puVar10 = (undefined8 *)(auStack_68 + -(uVar23 * 8 + 0x17 & 0xfffffffffffffff0));
        puVar12 = puVar10 + uVar23 * -2;
        puVar20 = puVar12;
        do {
          *puVar20 = 0;
          *(undefined4 *)(puVar20 + 1) = 0;
          puVar20 = puVar20 + 2;
        } while (puVar20 != puVar10);
        pnVar11 = ppnVar7[lVar22];
        uVar25 = pnVar11->keyvalue[0].first;
        local_54 = pnVar11->keyvalue[0].second;
        pnVar9 = *ppnVar18;
        iVar5 = pnVar9->sz;
        lVar14 = (long)iVar5;
        if (0 < lVar14) {
          lVar19 = 0;
          do {
            *(undefined8 *)((long)puVar10 + lVar19) =
                 *(undefined8 *)((long)&pnVar9->field_0 + lVar19);
            *(undefined8 *)((long)puVar12 + lVar19 * 2) =
                 *(undefined8 *)((long)&pnVar9->keyvalue[0].first + lVar19 * 2);
            *(undefined4 *)((long)puVar12 + lVar19 * 2 + 8) =
                 *(undefined4 *)((long)&pnVar9->keyvalue[0].second + lVar19 * 2);
            lVar19 = lVar19 + 8;
          } while (lVar14 * 8 - lVar19 != 0);
        }
        if (iVar5 < (int)uVar13) {
          lVar21 = uVar23 - lVar14;
          lVar19 = 0;
          do {
            *(undefined8 *)((long)puVar10 + lVar19 + lVar14 * 8) =
                 *(undefined8 *)((long)&pnVar11->field_0 + lVar19);
            *(undefined8 *)((long)puVar12 + lVar19 * 2 + lVar14 * 0x10) =
                 *(undefined8 *)((long)&pnVar11->keyvalue[0].first + lVar19 * 2);
            *(undefined4 *)((long)puVar12 + lVar19 * 2 + lVar14 * 0x10 + 8) =
                 *(undefined4 *)((long)&pnVar11->keyvalue[0].second + lVar19 * 2);
            lVar19 = lVar19 + 8;
            lVar21 = lVar21 + -1;
          } while (lVar21 != 0);
        }
        ppnVar7 = local_40;
        pos = (locType *)auStack_68._8_8_;
        uVar17 = uVar13 + 1 >> 1;
        pnVar9->sz = uVar17;
        iVar5 = uVar13 - uVar17;
        pnVar11->sz = iVar5;
        uVar23 = (ulong)(uint)pnVar9->sz;
        if (0 < pnVar9->sz) {
          lVar14 = 0;
          lVar19 = 0;
          do {
            (pnVar9->field_0).val[lVar19] = puVar10[lVar19];
            pnVar9 = *ppnVar18;
            *(undefined8 *)((long)&pnVar9->keyvalue[0].first + lVar14) =
                 *(undefined8 *)((long)puVar12 + lVar14);
            *(undefined4 *)((long)&pnVar9->keyvalue[0].second + lVar14) =
                 *(undefined4 *)((long)puVar12 + lVar14 + 8);
            lVar19 = lVar19 + 1;
            uVar23 = (ulong)pnVar9->sz;
            lVar14 = lVar14 + 0x10;
          } while (lVar19 < (long)uVar23);
          pnVar11 = local_40[lVar22];
          iVar5 = pnVar11->sz;
        }
        if (0 < iVar5) {
          lVar14 = 0x66;
          lVar19 = 0;
          do {
            (pnVar11->field_0).val[lVar19] = puVar10[(int)uVar23 + lVar19];
            uVar23 = (ulong)(*ppnVar18)->sz;
            pnVar11 = local_40[lVar22];
            *(undefined8 *)((long)pnVar11 + lVar14 * 8 + -8) = puVar12[(uVar23 + lVar19) * 2];
            *(undefined4 *)((long)&pnVar11->field_0 + lVar14 * 8) =
                 *(undefined4 *)(puVar12 + (uVar23 + lVar19) * 2 + 1);
            lVar19 = lVar19 + 1;
            lVar14 = lVar14 + 2;
          } while (lVar19 < pnVar11->sz);
        }
        pDVar2 = local_38->file;
        plVar16 = (locType *)(auStack_68._8_8_ + ((long)local_38->depth + -1) * 8);
        p_Var3 = (pDVar2->
                 super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                 )._vptr_FileManager_Base[3];
        puVar12[-1] = 0x113443;
        (*p_Var3)(pDVar2,plVar16);
        pDVar2 = local_38->file;
        iVar5 = local_38->depth;
        p_Var3 = (pDVar2->
                 super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                 )._vptr_FileManager_Base[3];
        puVar12[-1] = 0x11345f;
        (*p_Var3)(pDVar2,pos + iVar5);
        this_00 = local_38;
        ppVar15 = local_50;
        piVar8 = local_48;
        if (1 < local_38->depth) {
          uVar23 = (ulong)(local_38->depth - 2);
          plVar16 = pos + uVar23;
          lVar14 = uVar23 + 1;
          do {
            pnVar9 = ppnVar7[lVar14 + -1];
            iVar5 = local_48[lVar14 + -1];
            uVar23 = pnVar9->keyvalue[iVar5].first;
            if (((uVar23 <= uVar25) && (uVar25 <= uVar23)) &&
               (pnVar9->keyvalue[iVar5].second == local_54)) {
              pnVar11 = ppnVar7[lVar22];
              pnVar9->keyvalue[iVar5].first = pnVar11->keyvalue[0].first;
              pnVar9->keyvalue[iVar5].second = pnVar11->keyvalue[0].second;
              pDVar2 = local_38->file;
              p_Var3 = (pDVar2->
                       super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                       )._vptr_FileManager_Base[3];
              puVar12[-1] = 0x11350f;
              (*p_Var3)(pDVar2,plVar16);
              this_00 = local_38;
              ppVar15 = local_50;
              ppnVar7 = local_40;
              piVar8 = local_48;
              break;
            }
            plVar16 = plVar16 + -1;
            lVar19 = lVar14 + -1;
            bVar4 = 0 < lVar14;
            lVar14 = lVar19;
          } while (lVar19 != 0 && bVar4);
        }
      }
      *(undefined8 *)&ppVar15[-1].second = 0x113524;
      operator_delete__(ppnVar7);
      goto LAB_00113527;
    }
    uStack_70 = 0x1130b4;
    (*(local_38->file->
      super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      )._vptr_FileManager_Base[3])(local_38->file,pos + lVar22 + -1);
  }
  uStack_70 = 0x11315e;
  operator_delete__(ppnVar7);
LAB_00113527:
  *(undefined8 *)((long)ppVar15 + -8) = 0x11352c;
  operator_delete__(piVar8);
  *(undefined8 *)((long)ppVar15 + -8) = 0x113534;
  operator_delete__(pos);
  this_00->siz = this_00->siz + -1;
  return true;
}

Assistant:

bool erase(const Key &key) {
            if (!depth)return 0;
            int i, j;
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth + 1];
            memset(pos, 0, sizeof pos);
            p = new node *[depth + 1];
            pp = new int[depth + 1];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(key, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j == p[depth - 1]->sz || Compare()(key, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = x->keyvalue[1];
                        file->save(pos[i]);
                        break;
                    }
            }
            //file->release(x->pointer[j]);
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->val[i - 1] = x->val[i];
            --x->sz;
            if (depth == 1) {
                if (!x->sz) {
                    depth = 0;
                    file->release(root);
                    root = -1;
                } else {
                    file->save(root);
                }
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (x->sz >= degree >> 1) {
                file->save(pos[depth - 1]);
                delete[]p;
                delete[]pp;
                delete[]pos;
                --siz;
                return 1;
            }
            if (pp[depth - 2] == p[depth - 2]->sz) {
                p[depth] = p[depth - 1];
                pp[depth] = pp[depth - 2];
                pos[depth] = pos[depth - 1];
                pp[depth - 2] = p[depth - 2]->sz - 1;
                pos[depth - 1] = p[depth - 2]->pointer[pp[depth - 2]];
                p[depth - 1] = file->read(pos[depth - 1]);
            } else {
                pp[depth] = pp[depth - 2] + 1;
                pos[depth] = p[depth - 2]->pointer[pp[depth]];
                p[depth] = file->read(pos[depth]);
            }
            node *&y = p[depth];
            if (x->sz + y->sz < degree) {
                for (i = 0; i < y->sz; ++i)x->val[x->sz + i] = y->val[i], x->keyvalue[x->sz + i] = y->keyvalue[i];
                x->nxt = y->nxt;
                x->sz += y->sz;
                file->save(pos[depth - 1]);
                file->release(pos[depth]);
                erasenonleaf(depth - 2, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz;
                T tmpv[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                for (i = x->sz; i < newsz; ++i)tmpv[i] = y->val[i - x->sz], tmpk[i] = y->keyvalue[i - x->sz];
                x->sz = newsz + 1 >> 1;
                y->sz = newsz - x->sz;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                for (i = 0; i < y->sz; ++i)y->val[i] = tmpv[i + x->sz], y->keyvalue[i] = tmpk[i + x->sz];
                file->save(pos[depth - 1]);
                file->save(pos[depth]);
                for (i = depth - 2; i >= 0; --i)
                    if (equal(old, p[i]->keyvalue[pp[i]])) {
                        p[i]->keyvalue[pp[i]] = y->keyvalue[0];
                        file->save(pos[i]);
                        break;
                    }
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            --siz;
            return 1;
        }